

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O0

adios2_error adios2_engine_type(char *engine_type,size_t *size,adios2_io *io)

{
  adios2_error aVar1;
  adios2_io *in_RDX;
  IO *ioCpp;
  char *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [24];
  string *in_stack_ffffffffffffffd8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_40,"for const adios2_io, in call to adios2_io_engine_type",&local_41);
  adios2::helper::CheckForNullptr<adios2_io_const>(in_RDX,in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_78,"for size_t* size, in call to adios2_io_engine_type",&local_79);
  adios2::helper::CheckForNullptr<unsigned_long>((unsigned_long *)in_RDX,in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  aVar1 = anon_unknown.dwarf_edb6::String2CAPI
                    (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(size_t *)0x1518ee);
  return aVar1;
}

Assistant:

adios2_error adios2_engine_type(char *engine_type, size_t *size, const adios2_io *io)
{
    try
    {
        adios2::helper::CheckForNullptr(io,
                                        "for const adios2_io, in call to adios2_io_engine_type");
        adios2::helper::CheckForNullptr(size, "for size_t* size, in call to adios2_io_engine_type");

        const adios2::core::IO *ioCpp = reinterpret_cast<const adios2::core::IO *>(io);

        return String2CAPI(ioCpp->m_EngineType, engine_type, size);
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_engine_type"));
    }
}